

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyRandomnessInit(SyPRNGCtx *pCtx,ProcRandomSeed xSeed,void *pUserData)

{
  uchar uVar1;
  sxi32 in_EAX;
  int __fd;
  ssize_t sVar2;
  long lVar3;
  byte bVar4;
  __pid_t local_11c;
  char zSeed [256];
  
  if (pCtx->nMagic == 0x13c4) {
    return in_EAX;
  }
  __fd = open("/dev/urandom",0);
  if (-1 < __fd) {
    sVar2 = read(__fd,zSeed,0x100);
    close(__fd);
    if (0 < sVar2) goto LAB_00114554;
  }
  local_11c = getpid();
  SyMemcpy(&local_11c,zSeed,4);
  gettimeofday((timeval *)(zSeed + 4),(__timezone_ptr_t)0x0);
LAB_00114554:
  pCtx->i = '\0';
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    pCtx->s[lVar3] = (uchar)lVar3;
  }
  bVar4 = 0;
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    bVar4 = bVar4 + zSeed[lVar3] + pCtx->s[lVar3];
    uVar1 = pCtx->s[bVar4];
    pCtx->s[bVar4] = pCtx->s[lVar3];
    pCtx->s[lVar3] = uVar1;
  }
  pCtx->j = bVar4;
  pCtx->nMagic = 0x13c4;
  return 0x100;
}

Assistant:

JX9_PRIVATE sxi32 SyRandomnessInit(SyPRNGCtx *pCtx, ProcRandomSeed xSeed, void * pUserData)
{
	char zSeed[256];
	sxu8 t;
	sxi32 rc;
	sxu32 i;
	if( pCtx->nMagic == SXPRNG_MAGIC ){
		return SXRET_OK; /* Already initialized */
	}
 /* Initialize the state of the random number generator once, 
  ** the first time this routine is called.The seed value does
  ** not need to contain a lot of randomness since we are not
  ** trying to do secure encryption or anything like that...
  */	
	if( xSeed == 0 ){
		xSeed = SyOSUtilRandomSeed;
	}
	rc = xSeed(zSeed, sizeof(zSeed), pUserData);
	if( rc != SXRET_OK ){
		return rc;
	}
	pCtx->i = pCtx->j = 0;
	for(i=0; i < SX_ARRAYSIZE(pCtx->s) ; i++){
		pCtx->s[i] = (unsigned char)i;
    }
    for(i=0; i < sizeof(zSeed) ; i++){
      pCtx->j += pCtx->s[i] + zSeed[i];
      t = pCtx->s[pCtx->j];
      pCtx->s[pCtx->j] = pCtx->s[i];
      pCtx->s[i] = t;
    }
	pCtx->nMagic = SXPRNG_MAGIC;
	
	return SXRET_OK;
}